

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::~PosixMmapReadableFile(PosixMmapReadableFile *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  munmap(this->mmap_base_,this->length_);
  LOCK();
  (this->mmap_limiter_->acquires_allowed_).super___atomic_base<int>._M_i =
       (this->mmap_limiter_->acquires_allowed_).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  std::__cxx11::string::~string((string *)&this->filename_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PosixMmapReadableFile() override {
    ::munmap(static_cast<void*>(mmap_base_), length_);
    mmap_limiter_->Release();
  }